

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::addProgram
          (BinaryRegistryWriter *this,ProgramIdentifier *id,ProgramBinary *binary)

{
  size_t *psVar1;
  deUint32 index;
  deUint32 *pdVar2;
  ProgramIdentifierIndex PStack_68;
  
  pdVar2 = BinaryIndexHash::find(&this->m_binaryHash,binary);
  if (pdVar2 == (deUint32 *)0x0) {
    index = getNextSlot(this);
    addBinary(this,index,binary);
  }
  else {
    index = *pdVar2;
  }
  psVar1 = &(this->m_binaries).
            super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
            ._M_impl.super__Vector_impl_data._M_start[index].referenceCount;
  *psVar1 = *psVar1 + 1;
  ProgramIdentifier::ProgramIdentifier(&PStack_68.id,id);
  PStack_68.index = index;
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::emplace_back<vk::BinaryRegistryDetail::ProgramIdentifierIndex>
            (&this->m_binaryIndices,&PStack_68);
  ProgramIdentifier::~ProgramIdentifier(&PStack_68.id);
  return;
}

Assistant:

void BinaryRegistryWriter::addProgram (const ProgramIdentifier& id, const ProgramBinary& binary)
{
	const deUint32* const	indexPtr	= findBinary(binary);
	deUint32				index		= indexPtr ? *indexPtr : ~0u;

	if (!indexPtr)
	{
		index = getNextSlot();
		addBinary(index, binary);
	}

	m_binaries[index].referenceCount += 1;
	m_binaryIndices.push_back(ProgramIdentifierIndex(id, index));
}